

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseXMLParser.cpp
# Opt level: O2

bool __thiscall Rml::BaseXMLParser::ReadOpenTag(BaseXMLParser *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  bool bVar2;
  bool bVar3;
  iterator iVar4;
  bool parse_inner_xml_as_data;
  XMLAttributes attributes;
  String tag_name;
  String local_48;
  
  this->open_tag_depth = this->open_tag_depth + 1;
  if ((this->data)._M_string_length != 0) {
    if (this->inner_xml_data == false) {
      (*this->_vptr_BaseXMLParser[4])(this,&this->data,0);
    }
    (this->data)._M_string_length = 0;
    *(this->data)._M_dataplus._M_p = '\0';
  }
  tag_name._M_dataplus._M_p = (pointer)&tag_name.field_2;
  tag_name._M_string_length = 0;
  tag_name.field_2._M_local_buf[0] = '\0';
  bVar3 = FindWord(this,&tag_name,"/>");
  if (bVar3) {
    bVar3 = PeekString(this,">",true);
    if (bVar3) {
      attributes.m_container.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      attributes.m_container.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      attributes.m_container.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      HandleElementStartInternal(this,&tag_name,&attributes);
      ::std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
      ::~vector(&attributes.m_container);
LAB_0025215d:
      ::std::__cxx11::string::string((string *)&local_48,(string *)&tag_name);
      StringUtilities::ToLower((String *)&attributes,&local_48);
      ::std::__cxx11::string::~string((string *)&local_48);
      iVar4 = itlib::
              flat_set<std::__cxx11::string,itlib::fsimpl::less,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              ::find<std::__cxx11::string>
                        ((flat_set<std::__cxx11::string,itlib::fsimpl::less,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                          *)&this->cdata_tags,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &attributes);
      pbVar1 = (this->cdata_tags).m_container.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if ((iVar4._M_current == pbVar1) ||
         (bVar3 = ReadCDATA(this,(char *)attributes.m_container.
                                         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start), !bVar3)) {
        bVar3 = false;
      }
      else {
        this->open_tag_depth = this->open_tag_depth + -1;
        if ((this->data)._M_string_length != 0) {
          if (this->inner_xml_data == false) {
            (*this->_vptr_BaseXMLParser[4])(this,&this->data,1);
          }
          (this->data)._M_string_length = 0;
          *(this->data)._M_dataplus._M_p = '\0';
        }
        bVar3 = true;
        if (this->inner_xml_data == false) {
          (*this->_vptr_BaseXMLParser[3])(this,&tag_name);
        }
      }
      ::std::__cxx11::string::~string((string *)&attributes);
      if (iVar4._M_current != pbVar1) goto LAB_00252384;
    }
    else {
      bVar3 = PeekString(this,"/",true);
      if ((bVar3) && (bVar3 = PeekString(this,">",true), bVar3)) {
        attributes.m_container.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        attributes.m_container.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        attributes.m_container.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        HandleElementStartInternal(this,&tag_name,&attributes);
        ::std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
        ::~vector(&attributes.m_container);
        if (this->inner_xml_data == false) {
          (*this->_vptr_BaseXMLParser[3])(this,&tag_name);
        }
        this->open_tag_depth = this->open_tag_depth + -1;
      }
      else {
        parse_inner_xml_as_data = false;
        attributes.m_container.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        attributes.m_container.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        attributes.m_container.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        bVar3 = ReadAttributes(this,&attributes,&parse_inner_xml_as_data);
        if (bVar3) {
          bVar3 = PeekString(this,">",true);
          if (!bVar3) {
            bVar3 = PeekString(this,"/",true);
            if ((!bVar3) || (bVar3 = PeekString(this,">",true), !bVar3)) goto LAB_00252360;
            HandleElementStartInternal(this,&tag_name,&attributes);
            if (this->inner_xml_data == false) {
              (*this->_vptr_BaseXMLParser[3])(this,&tag_name);
            }
            this->open_tag_depth = this->open_tag_depth + -1;
            bVar3 = true;
            goto LAB_00252362;
          }
          HandleElementStartInternal(this,&tag_name,&attributes);
          bVar3 = true;
          if ((parse_inner_xml_as_data == true) && (this->inner_xml_data == false)) {
            this->inner_xml_data = true;
            this->inner_xml_data_terminate_depth = this->open_tag_depth;
            this->inner_xml_data_index_begin = this->xml_index;
          }
          bVar2 = true;
        }
        else {
LAB_00252360:
          bVar3 = false;
LAB_00252362:
          bVar2 = false;
        }
        ::std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
        ::~vector(&attributes.m_container);
        if (!bVar3) goto LAB_00252382;
        if (bVar2) goto LAB_0025215d;
      }
    }
    bVar3 = true;
  }
  else {
LAB_00252382:
    bVar3 = false;
  }
LAB_00252384:
  ::std::__cxx11::string::~string((string *)&tag_name);
  return bVar3;
}

Assistant:

bool BaseXMLParser::ReadOpenTag()
{
	// Increase the open depth
	open_tag_depth++;

	// Opening tag; send data immediately and open the tag.
	if (!data.empty())
	{
		HandleDataInternal(data, XMLDataType::Text);
		data.clear();
	}

	String tag_name;
	if (!FindWord(tag_name, "/>"))
		return false;

	bool section_opened = false;

	if (PeekString(">"))
	{
		// Simple open tag.
		HandleElementStartInternal(tag_name, XMLAttributes());
		section_opened = true;
	}
	else if (PeekString("/") && PeekString(">"))
	{
		// Empty open tag.
		HandleElementStartInternal(tag_name, XMLAttributes());
		HandleElementEndInternal(tag_name);

		// Tag immediately closed, reduce count
		open_tag_depth--;
	}
	else
	{
		// It appears we have some attributes. Let's parse them.
		bool parse_inner_xml_as_data = false;
		XMLAttributes attributes;
		if (!ReadAttributes(attributes, parse_inner_xml_as_data))
			return false;

		if (PeekString(">"))
		{
			HandleElementStartInternal(tag_name, attributes);
			section_opened = true;
		}
		else if (PeekString("/") && PeekString(">"))
		{
			HandleElementStartInternal(tag_name, attributes);
			HandleElementEndInternal(tag_name);

			// Tag immediately closed, reduce count
			open_tag_depth--;
		}
		else
		{
			return false;
		}

		if (section_opened && parse_inner_xml_as_data && !inner_xml_data)
		{
			inner_xml_data = true;
			inner_xml_data_terminate_depth = open_tag_depth;
			inner_xml_data_index_begin = xml_index;
		}
	}

	// Check if this tag needs to be processed as CDATA.
	if (section_opened)
	{
		const String lcase_tag_name = StringUtilities::ToLower(tag_name);
		bool is_cdata_tag = (cdata_tags.find(lcase_tag_name) != cdata_tags.end());

		if (is_cdata_tag)
		{
			if (ReadCDATA(lcase_tag_name.c_str()))
			{
				open_tag_depth--;
				if (!data.empty())
				{
					HandleDataInternal(data, XMLDataType::CData);
					data.clear();
				}
				HandleElementEndInternal(tag_name);

				return true;
			}

			return false;
		}
	}

	return true;
}